

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O2

SRes crnlib::LzmaEnc_CodeOneMemBlock
               (CLzmaEncHandle pp,Bool reInit,Byte *dest,size_t *destLen,UInt32 desiredPackSize,
               UInt32 *unpackSize)

{
  int iVar1;
  SRes SVar2;
  CSeqOutStreamBuf outStream;
  
  outStream.funcTable.Write = MyWrite;
  outStream.rem = *destLen;
  outStream.overflow = 0;
  *(undefined4 *)((long)pp + 0x3d330) = 0;
  *(undefined4 *)((long)pp + 0x3d344) = 0;
  *(undefined4 *)((long)pp + 0x3d34c) = 0;
  outStream.data = dest;
  if (reInit != 0) {
    LzmaEnc_Init((CLzmaEnc *)pp);
  }
  LzmaEnc_InitPrices((CLzmaEnc *)pp);
  iVar1 = *(int *)((long)pp + 0x3d338);
  RangeEnc_Init((CRangeEnc *)((long)pp + 0x3d2e8));
  *(CSeqOutStreamBuf **)((long)pp + 0x3d318) = &outStream;
  SVar2 = LzmaEnc_CodeOneBlock((CLzmaEnc *)pp,1,desiredPackSize,*unpackSize);
  *unpackSize = *(int *)((long)pp + 0x3d338) - iVar1;
  *destLen = *destLen - outStream.rem;
  if (outStream.overflow != 0) {
    SVar2 = 7;
  }
  return SVar2;
}

Assistant:

SRes LzmaEnc_CodeOneMemBlock(CLzmaEncHandle pp, Bool reInit,
                             Byte* dest, size_t* destLen, UInt32 desiredPackSize, UInt32* unpackSize) {
  CLzmaEnc* p = (CLzmaEnc*)pp;
  UInt64 nowPos64;
  SRes res;
  CSeqOutStreamBuf outStream;

  outStream.funcTable.Write = MyWrite;
  outStream.data = dest;
  outStream.rem = *destLen;
  outStream.overflow = False;

  p->writeEndMark = False;
  p->finished = False;
  p->result = SZ_OK;

  if (reInit)
    LzmaEnc_Init(p);
  LzmaEnc_InitPrices(p);
  nowPos64 = p->nowPos64;
  RangeEnc_Init(&p->rc);
  p->rc.outStream = &outStream.funcTable;

  res = LzmaEnc_CodeOneBlock(p, True, desiredPackSize, *unpackSize);

  *unpackSize = (UInt32)(p->nowPos64 - nowPos64);
  *destLen -= outStream.rem;
  if (outStream.overflow)
    return SZ_ERROR_OUTPUT_EOF;

  return res;
}